

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

size_t Imf_3_3::anon_unknown_3::getVariableLengthIntegerSize(uint64_t value)

{
  uint64_t value_local;
  undefined8 local_8;
  
  if (value < 0x80) {
    local_8 = 1;
  }
  else if (value < 0x4000) {
    local_8 = 2;
  }
  else if (value < 0x200000) {
    local_8 = 3;
  }
  else if (value < 0x10000000) {
    local_8 = 4;
  }
  else if (value < 0x800000000) {
    local_8 = 5;
  }
  else if (value < 0x40000000000) {
    local_8 = 6;
  }
  else if (value < 0x2000000000000) {
    local_8 = 7;
  }
  else if (value < 0x100000000000000) {
    local_8 = 8;
  }
  else if (value < 0x8000000000000000) {
    local_8 = 9;
  }
  else {
    local_8 = 10;
  }
  return local_8;
}

Assistant:

size_t
getVariableLengthIntegerSize (uint64_t value)
{

    if (value < 1llu << 7) { return 1; }

    if (value < 1llu << 14) { return 2; }
    if (value < 1llu << 21) { return 3; }
    if (value < 1llu << 28) { return 4; }
    if (value < 1llu << 35) { return 5; }
    if (value < 1llu << 42) { return 6; }
    if (value < 1llu << 49) { return 7; }
    if (value < 1llu << 56) { return 8; }
    if (value < 1llu << 63) { return 9; }
    return 10;
}